

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfsemulatorscreen.cpp
# Opt level: O0

void __thiscall
QEglFSEmulatorScreen::initFromJsonObject(QEglFSEmulatorScreen *this,QJsonObject *description)

{
  bool bVar1;
  int iVar2;
  undefined4 uVar3;
  QJsonValue *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  double dVar4;
  QJsonObject physicalSizeObject;
  QJsonObject geometryObject;
  QJsonValue value;
  undefined4 in_stack_fffffffffffffcc8;
  int in_stack_fffffffffffffccc;
  QRect *in_stack_fffffffffffffcd0;
  char *in_stack_fffffffffffffcd8;
  QJsonValue *str;
  undefined8 local_1b0;
  undefined8 local_1a8 [4];
  QJsonValue local_188 [24];
  QJsonValue local_170 [24];
  QJsonValue local_158 [24];
  QJsonValue local_140 [24];
  QJsonValue local_128 [24];
  QJsonValue local_110 [24];
  QJsonValue local_f8 [24];
  QJsonValue local_e0 [24];
  QJsonValue local_c8 [24];
  QJsonValue local_b0 [24];
  QJsonValue local_98 [24];
  QJsonValue local_80 [24];
  QJsonValue local_68 [24];
  QJsonValue local_50 [24];
  QJsonValue local_38 [24];
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QJsonValue::QJsonValue((QJsonValue *)&local_20,Null);
  Qt::Literals::StringLiterals::operator____L1
            (in_stack_fffffffffffffcd8,(size_t)in_stack_fffffffffffffcd0);
  QJsonObject::value((QLatin1String *)local_38);
  QJsonValue::operator=
            ((QJsonValue *)in_stack_fffffffffffffcd0,
             (QJsonValue *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
  QJsonValue::~QJsonValue(local_38);
  bVar1 = QJsonValue::isUndefined((QJsonValue *)0x105baa);
  if ((!bVar1) && (bVar1 = QJsonValue::isDouble((QJsonValue *)0x105bbb), bVar1)) {
    uVar3 = QJsonValue::toInt((int)&local_20);
    *(undefined4 *)(in_RDI + 0x74) = uVar3;
  }
  Qt::Literals::StringLiterals::operator____L1
            (in_stack_fffffffffffffcd8,(size_t)in_stack_fffffffffffffcd0);
  QJsonObject::value((QLatin1String *)local_50);
  QJsonValue::operator=
            ((QJsonValue *)in_stack_fffffffffffffcd0,
             (QJsonValue *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
  QJsonValue::~QJsonValue(local_50);
  bVar1 = QJsonValue::isUndefined((QJsonValue *)0x105c59);
  if ((!bVar1) && (bVar1 = QJsonValue::isString((QJsonValue *)0x105c6a), bVar1)) {
    QJsonValue::toString();
    QString::operator=((QString *)in_stack_fffffffffffffcd0,
                       (QString *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    QString::~QString((QString *)0x105ca8);
  }
  Qt::Literals::StringLiterals::operator____L1
            (in_stack_fffffffffffffcd8,(size_t)in_stack_fffffffffffffcd0);
  QJsonObject::value((QLatin1String *)local_68);
  QJsonValue::operator=
            ((QJsonValue *)in_stack_fffffffffffffcd0,
             (QJsonValue *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
  QJsonValue::~QJsonValue(local_68);
  bVar1 = QJsonValue::isUndefined((QJsonValue *)0x105d27);
  if ((!bVar1) && (bVar1 = QJsonValue::isObject((QJsonValue *)0x105d3c), bVar1)) {
    local_1a8[0] = 0xaaaaaaaaaaaaaaaa;
    QJsonValue::toObject();
    Qt::Literals::StringLiterals::operator____L1
              (in_stack_fffffffffffffcd8,(size_t)in_stack_fffffffffffffcd0);
    QJsonObject::value((QLatin1String *)local_80);
    QJsonValue::operator=
              ((QJsonValue *)in_stack_fffffffffffffcd0,
               (QJsonValue *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    QJsonValue::~QJsonValue(local_80);
    bVar1 = QJsonValue::isUndefined((QJsonValue *)0x105dde);
    if ((!bVar1) && (bVar1 = QJsonValue::isDouble((QJsonValue *)0x105def), bVar1)) {
      QJsonValue::toInt((int)&local_20);
      QRect::setX(in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc);
    }
    Qt::Literals::StringLiterals::operator____L1
              (in_stack_fffffffffffffcd8,(size_t)in_stack_fffffffffffffcd0);
    QJsonObject::value((QLatin1String *)local_98);
    QJsonValue::operator=
              ((QJsonValue *)in_stack_fffffffffffffcd0,
               (QJsonValue *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    QJsonValue::~QJsonValue(local_98);
    bVar1 = QJsonValue::isUndefined((QJsonValue *)0x105e93);
    if ((!bVar1) && (bVar1 = QJsonValue::isDouble((QJsonValue *)0x105ea4), bVar1)) {
      QJsonValue::toInt((int)&local_20);
      QRect::setY(in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc);
    }
    Qt::Literals::StringLiterals::operator____L1
              (in_stack_fffffffffffffcd8,(size_t)in_stack_fffffffffffffcd0);
    QJsonObject::value((QLatin1String *)local_b0);
    QJsonValue::operator=
              ((QJsonValue *)in_stack_fffffffffffffcd0,
               (QJsonValue *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    QJsonValue::~QJsonValue(local_b0);
    bVar1 = QJsonValue::isUndefined((QJsonValue *)0x105f48);
    if ((!bVar1) && (bVar1 = QJsonValue::isDouble((QJsonValue *)0x105f59), bVar1)) {
      QJsonValue::toInt((int)&local_20);
      QRect::setWidth(in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc);
    }
    Qt::Literals::StringLiterals::operator____L1
              (in_stack_fffffffffffffcd8,(size_t)in_stack_fffffffffffffcd0);
    QJsonObject::value((QLatin1String *)local_c8);
    QJsonValue::operator=
              ((QJsonValue *)in_stack_fffffffffffffcd0,
               (QJsonValue *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    QJsonValue::~QJsonValue(local_c8);
    bVar1 = QJsonValue::isUndefined((QJsonValue *)0x105ffd);
    if ((!bVar1) && (bVar1 = QJsonValue::isDouble((QJsonValue *)0x10600e), bVar1)) {
      QJsonValue::toInt((int)&local_20);
      QRect::setHeight(in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc);
    }
    QJsonObject::~QJsonObject((QJsonObject *)local_1a8);
  }
  Qt::Literals::StringLiterals::operator____L1
            (in_stack_fffffffffffffcd8,(size_t)in_stack_fffffffffffffcd0);
  QJsonObject::value((QLatin1String *)local_e0);
  QJsonValue::operator=
            ((QJsonValue *)in_stack_fffffffffffffcd0,
             (QJsonValue *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
  QJsonValue::~QJsonValue(local_e0);
  bVar1 = QJsonValue::isUndefined((QJsonValue *)0x1060c9);
  if ((!bVar1) && (bVar1 = QJsonValue::isDouble((QJsonValue *)0x1060da), bVar1)) {
    uVar3 = QJsonValue::toInt((int)&local_20);
    *(undefined4 *)(in_RDI + 0x50) = uVar3;
  }
  Qt::Literals::StringLiterals::operator____L1
            (in_stack_fffffffffffffcd8,(size_t)in_stack_fffffffffffffcd0);
  QJsonObject::value((QLatin1String *)local_f8);
  QJsonValue::operator=
            ((QJsonValue *)in_stack_fffffffffffffcd0,
             (QJsonValue *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
  QJsonValue::~QJsonValue(local_f8);
  bVar1 = QJsonValue::isUndefined((QJsonValue *)0x106178);
  if ((!bVar1) && (bVar1 = QJsonValue::isDouble((QJsonValue *)0x106189), bVar1)) {
    uVar3 = QJsonValue::toInt((int)&local_20);
    *(undefined4 *)(in_RDI + 0x54) = uVar3;
  }
  Qt::Literals::StringLiterals::operator____L1
            (in_stack_fffffffffffffcd8,(size_t)in_stack_fffffffffffffcd0);
  QJsonObject::value((QLatin1String *)local_110);
  QJsonValue::operator=
            ((QJsonValue *)in_stack_fffffffffffffcd0,
             (QJsonValue *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
  QJsonValue::~QJsonValue(local_110);
  bVar1 = QJsonValue::isUndefined((QJsonValue *)0x106227);
  if ((!bVar1) && (bVar1 = QJsonValue::isObject((QJsonValue *)0x10623c), bVar1)) {
    local_1b0 = 0xaaaaaaaaaaaaaaaa;
    QJsonValue::toObject();
    Qt::Literals::StringLiterals::operator____L1
              (in_stack_fffffffffffffcd8,(size_t)in_stack_fffffffffffffcd0);
    QJsonObject::value((QLatin1String *)local_128);
    QJsonValue::operator=
              ((QJsonValue *)in_stack_fffffffffffffcd0,
               (QJsonValue *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    QJsonValue::~QJsonValue(local_128);
    bVar1 = QJsonValue::isUndefined((QJsonValue *)0x1062de);
    if ((!bVar1) && (bVar1 = QJsonValue::isDouble((QJsonValue *)0x1062ef), bVar1)) {
      iVar2 = QJsonValue::toInt((int)&local_20);
      QSizeF::setWidth((QSizeF *)(in_RDI + 0x58),(double)iVar2);
    }
    Qt::Literals::StringLiterals::operator____L1
              (in_stack_fffffffffffffcd8,(size_t)in_stack_fffffffffffffcd0);
    QJsonObject::value((QLatin1String *)local_140);
    QJsonValue::operator=
              ((QJsonValue *)in_stack_fffffffffffffcd0,
               (QJsonValue *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    QJsonValue::~QJsonValue(local_140);
    bVar1 = QJsonValue::isUndefined((QJsonValue *)0x106395);
    if ((!bVar1) && (bVar1 = QJsonValue::isDouble((QJsonValue *)0x1063a6), bVar1)) {
      iVar2 = QJsonValue::toInt((int)&local_20);
      QSizeF::setHeight((QSizeF *)(in_RDI + 0x58),(double)iVar2);
    }
    QJsonObject::~QJsonObject((QJsonObject *)&local_1b0);
  }
  Qt::Literals::StringLiterals::operator____L1
            (in_stack_fffffffffffffcd8,(size_t)in_stack_fffffffffffffcd0);
  QJsonObject::value((QLatin1String *)local_158);
  QJsonValue::operator=
            ((QJsonValue *)in_stack_fffffffffffffcd0,
             (QJsonValue *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
  QJsonValue::~QJsonValue(local_158);
  bVar1 = QJsonValue::isUndefined((QJsonValue *)0x106463);
  if ((!bVar1) && (bVar1 = QJsonValue::isDouble((QJsonValue *)0x106474), bVar1)) {
    dVar4 = (double)QJsonValue::toDouble(0.0);
    *(float *)(in_RDI + 0x68) = (float)dVar4;
  }
  str = in_RSI;
  Qt::Literals::StringLiterals::operator____L1((char *)in_RSI,(size_t)in_stack_fffffffffffffcd0);
  QJsonObject::value((QLatin1String *)local_170);
  QJsonValue::operator=
            ((QJsonValue *)in_stack_fffffffffffffcd0,
             (QJsonValue *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
  QJsonValue::~QJsonValue(local_170);
  bVar1 = QJsonValue::isUndefined((QJsonValue *)0x106517);
  if ((!bVar1) && (bVar1 = QJsonValue::isDouble((QJsonValue *)0x106528), bVar1)) {
    uVar3 = QJsonValue::toInt((int)&local_20);
    *(undefined4 *)(in_RDI + 0x6c) = uVar3;
  }
  Qt::Literals::StringLiterals::operator____L1((char *)str,(size_t)in_RSI);
  QJsonObject::value((QLatin1String *)local_188);
  QJsonValue::operator=
            (in_RSI,(QJsonValue *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
  QJsonValue::~QJsonValue(local_188);
  bVar1 = QJsonValue::isUndefined((QJsonValue *)0x1065c6);
  if ((!bVar1) && (bVar1 = QJsonValue::isDouble((QJsonValue *)0x1065d7), bVar1)) {
    uVar3 = QJsonValue::toInt((int)&local_20);
    *(undefined4 *)(in_RDI + 0x70) = uVar3;
  }
  QJsonValue::~QJsonValue((QJsonValue *)&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QEglFSEmulatorScreen::initFromJsonObject(const QJsonObject &description)
{
    QJsonValue value;

    value = description.value("id"_L1);
    if (!value.isUndefined() && value.isDouble())
        m_id = value.toInt();

    value = description.value("description"_L1);
    if (!value.isUndefined() && value.isString())
        m_description = value.toString();

    value = description.value("geometry"_L1);
    if (!value.isUndefined() && value.isObject()) {
        QJsonObject geometryObject = value.toObject();
        value = geometryObject.value("x"_L1);
        if (!value.isUndefined() && value.isDouble())
            m_geometry.setX(value.toInt());
        value = geometryObject.value("y"_L1);
        if (!value.isUndefined() && value.isDouble())
            m_geometry.setY(value.toInt());
        value = geometryObject.value("width"_L1);
        if (!value.isUndefined() && value.isDouble())
            m_geometry.setWidth(value.toInt());
        value = geometryObject.value("height"_L1);
        if (!value.isUndefined() && value.isDouble())
            m_geometry.setHeight(value.toInt());
    }

    value = description.value("depth"_L1);
    if (!value.isUndefined() && value.isDouble())
        m_depth = value.toInt();

    value = description.value("format"_L1);
    if (!value.isUndefined() && value.isDouble())
        m_format = static_cast<QImage::Format>(value.toInt());

    value = description.value("physicalSize"_L1);
    if (!value.isUndefined() && value.isObject()) {
        QJsonObject physicalSizeObject = value.toObject();
        value = physicalSizeObject.value("width"_L1);
        if (!value.isUndefined() && value.isDouble())
            m_physicalSize.setWidth(value.toInt());
        value = physicalSizeObject.value("height"_L1);
        if (!value.isUndefined() && value.isDouble())
            m_physicalSize.setHeight(value.toInt());
    }


    value = description.value("refreshRate"_L1);
    if (!value.isUndefined() && value.isDouble())
        m_refreshRate = value.toDouble();

    value = description.value("nativeOrientation"_L1);
    if (!value.isUndefined() && value.isDouble())
        m_nativeOrientation = static_cast<Qt::ScreenOrientation>(value.toInt());

    value = description.value("orientation"_L1);
    if (!value.isUndefined() && value.isDouble())
        m_orientation = static_cast<Qt::ScreenOrientation>(value.toInt());
}